

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O1

void rngDestroy(void)

{
  mtMtxLock(_mtx);
  blobClose(_state);
  _state = (rng_state_st *)0x0;
  _ctr = 0;
  mtMtxUnlock(_mtx);
  mtMtxClose(_mtx);
  return;
}

Assistant:

static void rngDestroy()
{
	// закрыть состояние (могли забыть)
	mtMtxLock(_mtx);
	blobClose(_state), _state = 0, _ctr = 0;
	mtMtxUnlock(_mtx);
	// закрыть мьютекс
	mtMtxClose(_mtx);
}